

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

int dlmalloc_trim(size_t pad)

{
  int iVar1;
  size_t in_RSI;
  bool bVar2;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (((byte)_gm_.mflags & 2) != 0) {
    LOCK();
    UNLOCK();
    bVar2 = _gm_.mutex != 0;
    _gm_.mutex = 1;
    if (bVar2) {
      spin_acquire_lock(&_gm_.mutex);
    }
  }
  iVar1 = sys_trim((mstate)pad,in_RSI);
  if (((byte)_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return iVar1;
}

Assistant:

int dlmalloc_trim(size_t pad) {
  int result = 0;
  ensure_initialization();
  if (!PREACTION(gm)) {
    result = sys_trim(gm, pad);
    POSTACTION(gm);
  }
  return result;
}